

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

void __thiscall directory::grow(directory *this)

{
  value_type vVar1;
  reference pvVar2;
  uint local_18;
  int i;
  int double_size;
  directory *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->bucket_ids,(long)(1 << ((char)this->depth + 1U & 0x1f)));
  for (local_18 = 0; local_18 < this->bucket_size; local_18 = local_18 + 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->bucket_ids,(long)(int)local_18);
    vVar1 = *pvVar2;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->bucket_ids,(long)(int)(local_18 + (1 << ((byte)this->depth & 0x1f))))
    ;
    *pvVar2 = vVar1;
  }
  this->bucket_size = this->bucket_size << 1;
  this->depth = this->depth + 1;
  return;
}

Assistant:

void directory::grow() {

    int double_size = 1 << depth + 1;

    bucket_ids.resize(double_size);

    for (int i = 0; i < bucket_size; ++i) {
        bucket_ids[i + (1 << depth)] = bucket_ids[i];
    }

    bucket_size = bucket_size << 1;

    depth++;
}